

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

void __thiscall
google::FlagRegisterer::FlagRegisterer
          (FlagRegisterer *this,char *name,char *type,char *help,char *filename,
          void *current_storage,void *defvalue_storage)

{
  size_t *psVar1;
  _Rb_tree_header *__x;
  _Base_ptr p_Var2;
  _Base_ptr __y;
  ulong uVar3;
  FlagRegistry *pFVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  _Base_ptr p_Var8;
  FlagValue *this_00;
  _Base_ptr p_Var9;
  FlagRegistry *pFVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  iterator iVar13;
  _Base_ptr p_Var14;
  iterator iVar15;
  uint uVar16;
  _Base_ptr *pp_Var17;
  bool bVar18;
  
  pcVar7 = strchr(type,0x3a);
  if (pcVar7 != (char *)0x0) {
    pcVar7 = strrchr(type,0x3a);
    type = pcVar7 + 1;
  }
  p_Var8 = (_Base_ptr)operator_new(0x10);
  anon_unknown_1::FlagValue::FlagValue((FlagValue *)p_Var8,current_storage,type,false);
  this_00 = (FlagValue *)operator_new(0x10);
  anon_unknown_1::FlagValue::FlagValue(this_00,defvalue_storage,type,false);
  p_Var14 = (_Base_ptr)0x19954b;
  if (help != (char *)0x0) {
    p_Var14 = (_Base_ptr)help;
  }
  p_Var9 = (_Base_ptr)operator_new(0x38);
  *(char **)p_Var9 = name;
  p_Var9->_M_parent = p_Var14;
  p_Var9->_M_left = (_Base_ptr)filename;
  *(undefined1 *)&p_Var9->_M_right = 0;
  *(FlagValue **)(p_Var9 + 1) = this_00;
  p_Var9[1]._M_parent = p_Var8;
  p_Var9[1]._M_left = (_Base_ptr)0x0;
  pFVar10 = anon_unknown_1::FlagRegistry::GlobalRegistry();
  gflags_mutex_namespace::Mutex::Lock(&pFVar10->lock_);
  pcVar7 = *(char **)p_Var9;
  p_Var11 = (_Rb_tree_node_base *)operator_new(0x30);
  *(char **)(p_Var11 + 1) = pcVar7;
  p_Var11[1]._M_parent = p_Var9;
  p_Var14 = &(pFVar10->flags_)._M_t._M_impl.super__Rb_tree_header._M_header;
  uVar16 = 1;
  p_Var8 = p_Var14;
  pFVar4 = pFVar10;
  while (p_Var2 = (pFVar4->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
        p_Var2 != (_Base_ptr)0x0) {
    uVar5 = strcmp(pcVar7,*(char **)(p_Var2 + 1));
    uVar16 = uVar5 >> 0x1f;
    pFVar4 = (FlagRegistry *)(&p_Var2->_M_color + (ulong)(~uVar5 >> 0x1f) * 2);
    p_Var8 = p_Var2;
  }
  p_Var12 = p_Var8;
  if (uVar16 == 0) {
LAB_0019069f:
    iVar6 = strcmp(*(char **)(p_Var12 + 1),pcVar7);
    if (iVar6 < 0) goto LAB_001906af;
    operator_delete(p_Var11);
    p_Var14 = (p_Var12[1]._M_parent)->_M_left;
    p_Var8 = p_Var9->_M_left;
    iVar6 = strcmp((char *)p_Var14,(char *)p_Var8);
    if (iVar6 == 0) {
      pcVar7 = 
      "ERROR: something wrong with flag \'%s\' in file \'%s\'.  One possibility: file \'%s\' is being linked both statically and dynamically into this executable.\n"
      ;
      p_Var14 = p_Var8;
    }
    else {
      pcVar7 = "ERROR: flag \'%s\' was defined more than once (in files \'%s\' and \'%s\').\n";
    }
    anon_unknown_1::ReportError(DIE,pcVar7,*(undefined8 *)p_Var9,p_Var14,p_Var8);
  }
  else {
    if (p_Var8 != (pFVar10->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var8);
      goto LAB_0019069f;
    }
LAB_001906af:
    if (p_Var14 == p_Var8) {
      bVar18 = true;
    }
    else {
      iVar6 = strcmp(pcVar7,*(char **)(p_Var8 + 1));
      bVar18 = SUB41((uint)iVar6 >> 0x1f,0);
    }
    std::_Rb_tree_insert_and_rebalance(bVar18,p_Var11,p_Var8,p_Var14);
    psVar1 = &(pFVar10->flags_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar1 = *psVar1 + 1;
  }
  __y = p_Var9[1]._M_parent;
  __x = &(pFVar10->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header;
  iVar13 = std::
           _Rb_tree<const_void_*,_std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>_>
           ::_M_lower_bound((_Rb_tree<const_void_*,_std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>,_std::_Select1st<std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_google::(anonymous_namespace)::CommandLineFlag_*>_>_>
                             *)(pFVar10->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header
                               ._M_parent,(_Link_type)__x,__y,(void **)p_Var14);
  iVar15 = iVar13;
  if (((_Rb_tree_header *)iVar13._M_node != __x) &&
     (*(ulong *)(iVar13._M_node + 1) <= *(ulong *)__y)) goto LAB_001908a4;
  p_Var11 = (_Rb_tree_node_base *)operator_new(0x30);
  uVar3 = *(ulong *)__y;
  p_Var11[1]._M_parent = (_Base_ptr)0x0;
  *(ulong *)(p_Var11 + 1) = uVar3;
  if ((_Rb_tree_header *)iVar13._M_node == __x) {
    if (((pFVar10->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
       (iVar13._M_node =
             (pFVar10->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
       uVar3 <= *(ulong *)(iVar13._M_node + 1))) {
LAB_0019080f:
      bVar18 = true;
      pp_Var17 = &(pFVar10->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      iVar13._M_node = &__x->_M_header;
      while (p_Var14 = *pp_Var17, p_Var14 != (_Base_ptr)0x0) {
        bVar18 = uVar3 < *(ulong *)(p_Var14 + 1);
        iVar13._M_node = p_Var14;
        pp_Var17 = (_Base_ptr *)((long)p_Var14 + 0x20 + -0x10 + (ulong)!bVar18 * 8);
      }
      iVar15._M_node = iVar13._M_node;
      if (bVar18) {
        if (iVar13._M_node ==
            (pFVar10->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
        goto LAB_0019085c;
        iVar15._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar13._M_node);
      }
      if (uVar3 <= *(ulong *)(iVar15._M_node + 1)) {
LAB_00190899:
        operator_delete(p_Var11);
        goto LAB_001908a4;
      }
    }
LAB_0019085c:
    iVar15._M_node = (_Base_ptr)0x0;
  }
  else if (uVar3 < *(ulong *)(iVar13._M_node + 1)) {
    iVar15._M_node = (pFVar10->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = iVar15._M_node;
    if (iVar15._M_node == iVar13._M_node) {
LAB_00190862:
      iVar13._M_node = p_Var14;
      if (p_Var14 == (_Base_ptr)0x0) goto LAB_00190899;
    }
    else {
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(iVar13._M_node);
      if (uVar3 <= *(ulong *)(p_Var12 + 1)) goto LAB_0019080f;
      iVar15 = iVar13;
      if (p_Var12->_M_right == (_Base_ptr)0x0) {
        iVar15._M_node = (_Base_ptr)0x0;
        iVar13._M_node = p_Var12;
      }
    }
  }
  else {
    if (uVar3 <= *(ulong *)(iVar13._M_node + 1)) goto LAB_00190899;
    p_Var14 = (pFVar10->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    if (p_Var14 == iVar13._M_node) {
      iVar15._M_node = (_Base_ptr)0x0;
      goto LAB_00190862;
    }
    p_Var14 = (_Base_ptr)std::_Rb_tree_increment(iVar13._M_node);
    if (*(ulong *)(p_Var14 + 1) <= uVar3) goto LAB_0019080f;
    iVar15._M_node = (iVar13._M_node)->_M_right;
    if ((iVar13._M_node)->_M_right != (_Base_ptr)0x0) {
      iVar15._M_node = p_Var14;
      iVar13._M_node = p_Var14;
    }
  }
  bVar18 = true;
  if ((iVar15._M_node == (_Base_ptr)0x0) && (__x != (_Rb_tree_header *)iVar13._M_node)) {
    bVar18 = uVar3 < *(ulong *)(iVar13._M_node + 1);
  }
  std::_Rb_tree_insert_and_rebalance(bVar18,p_Var11,iVar13._M_node,&__x->_M_header);
  psVar1 = &(pFVar10->flags_by_ptr_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *psVar1 = *psVar1 + 1;
  iVar15._M_node = p_Var11;
LAB_001908a4:
  iVar15._M_node[1]._M_parent = p_Var9;
  gflags_mutex_namespace::Mutex::Unlock(&pFVar10->lock_);
  return;
}

Assistant:

FlagRegisterer::FlagRegisterer(const char* name, const char* type,
                               const char* help, const char* filename,
                               void* current_storage, void* defvalue_storage) {
  if (help == NULL)
    help = "";
  // FlagValue expects the type-name to not include any namespace
  // components, so we get rid of those, if any.
  if (strchr(type, ':'))
    type = strrchr(type, ':') + 1;
  FlagValue* current = new FlagValue(current_storage, type, false);
  FlagValue* defvalue = new FlagValue(defvalue_storage, type, false);
  // Importantly, flag_ will never be deleted, so storage is always good.
  CommandLineFlag* flag = new CommandLineFlag(name, help, filename,
                                              current, defvalue);
  FlagRegistry::GlobalRegistry()->RegisterFlag(flag);   // default registry
}